

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int io_type(lua_State *L)

{
  int iVar1;
  long *plVar2;
  size_t len;
  char *s;
  
  luaL_checkany(L,1);
  plVar2 = (long *)lua_touserdata(L,1);
  lua_getfield(L,-10000,"FILE*");
  if (((plVar2 != (long *)0x0) && (iVar1 = lua_getmetatable(L,1), iVar1 != 0)) &&
     (iVar1 = lua_rawequal(L,-2,-1), iVar1 != 0)) {
    if (*plVar2 == 0) {
      s = "closed file";
      len = 0xb;
    }
    else {
      s = "file";
      len = 4;
    }
    lua_pushlstring(L,s,len);
    return 1;
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int io_type (lua_State *L) {
  void *ud;
  luaL_checkany(L, 1);
  ud = lua_touserdata(L, 1);
  lua_getfield(L, LUA_REGISTRYINDEX, LUA_FILEHANDLE);
  if (ud == NULL || !lua_getmetatable(L, 1) || !lua_rawequal(L, -2, -1))
    lua_pushnil(L);  /* not a file */
  else if (*((FILE **)ud) == NULL)
    lua_pushliteral(L, "closed file");
  else
    lua_pushliteral(L, "file");
  return 1;
}